

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O3

Primer * __thiscall ASDCP::MXF::Primer::InitFromBuffer(Primer *this,byte_t *p,ui32_t l)

{
  _Rb_tree<ASDCP::UL,_std::pair<const_ASDCP::UL,_ASDCP::TagValue>,_std::_Select1st<std::pair<const_ASDCP::UL,_ASDCP::TagValue>_>,_std::less<ASDCP::UL>,_std::allocator<std::pair<const_ASDCP::UL,_ASDCP::TagValue>_>_>
  *this_00;
  bool bVar1;
  MDDEntry *pMVar2;
  ILogSink *pIVar3;
  h__PrimerLookup *this_01;
  _Rb_tree_header *p_Var4;
  uint in_ECX;
  undefined4 in_register_00000014;
  Result_t result;
  MemIOReader MemRDR;
  undefined **local_110;
  undefined1 local_108;
  undefined8 local_107;
  undefined8 uStack_ff;
  KLVPacket local_a8;
  MemIOReader local_40;
  
  if (*(Dictionary **)(p + 200) == (Dictionary *)0x0) {
    __assert_fail("m_Dict",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/MXF.cpp"
                  ,0x1d4,
                  "virtual ASDCP::Result_t ASDCP::MXF::Primer::InitFromBuffer(const byte_t *, ui32_t)"
                 );
  }
  pMVar2 = Dictionary::Type(*(Dictionary **)(p + 200),MDD_Primer);
  local_108 = 1;
  local_107 = *(undefined8 *)pMVar2->ul;
  uStack_ff = *(undefined8 *)(pMVar2->ul + 8);
  local_110 = &PTR__IArchive_0021d318;
  KLVPacket::InitFromBuffer(&local_a8,p,l,(UL *)(ulong)in_ECX);
  if ((int)local_a8._vptr_KLVPacket < 0) goto LAB_001a4cbc;
  if ((byte_t *)(CONCAT44(in_register_00000014,l) + (ulong)in_ECX) <
      *(byte_t **)(p + 0x18) + *(long *)(p + 0x20)) {
    pIVar3 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(pIVar3,"Primer entry too long.\n");
    local_110 = (undefined **)CONCAT44(local_110._4_4_,0x1dc);
    Kumu::Result_t::operator()((int *)this,ASDCP::RESULT_KLV_CODING);
    goto LAB_001a4cdf;
  }
  Kumu::MemIOReader::MemIOReader(&local_40,*(byte_t **)(p + 0x18),(ui32_t)*(long *)(p + 0x20));
  bVar1 = FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::MXF::Primer::LocalTagEntry>_>::
          Unarchive((FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::MXF::Primer::LocalTagEntry>_>
                     *)(p + 0x88),&local_40);
  if (bVar1) {
    Kumu::Result_t::Result_t((Result_t *)&local_110,(Result_t *)&Kumu::RESULT_OK);
  }
  else {
    Kumu::Result_t::operator()((int *)&local_110,ASDCP::RESULT_KLV_CODING);
  }
  Kumu::Result_t::operator=((Result_t *)&local_a8,(Result_t *)&local_110);
  Kumu::Result_t::~Result_t((Result_t *)&local_110);
  if ((int)local_a8._vptr_KLVPacket < 0) {
LAB_001a4cbc:
    pIVar3 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(pIVar3,"Failed to initialize Primer.\n");
  }
  else {
    this_01 = (h__PrimerLookup *)operator_new(0x30);
    p_Var4 = &(this_01->
              super_map<ASDCP::UL,_ASDCP::TagValue,_std::less<ASDCP::UL>,_std::allocator<std::pair<const_ASDCP::UL,_ASDCP::TagValue>_>_>
              )._M_t._M_impl.super__Rb_tree_header;
    (this_01->
    super_map<ASDCP::UL,_ASDCP::TagValue,_std::less<ASDCP::UL>,_std::allocator<std::pair<const_ASDCP::UL,_ASDCP::TagValue>_>_>
    )._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (this_01->
    super_map<ASDCP::UL,_ASDCP::TagValue,_std::less<ASDCP::UL>,_std::allocator<std::pair<const_ASDCP::UL,_ASDCP::TagValue>_>_>
    )._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (this_01->
    super_map<ASDCP::UL,_ASDCP::TagValue,_std::less<ASDCP::UL>,_std::allocator<std::pair<const_ASDCP::UL,_ASDCP::TagValue>_>_>
    )._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var4->_M_header;
    (this_01->
    super_map<ASDCP::UL,_ASDCP::TagValue,_std::less<ASDCP::UL>,_std::allocator<std::pair<const_ASDCP::UL,_ASDCP::TagValue>_>_>
    )._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var4->_M_header;
    (this_01->
    super_map<ASDCP::UL,_ASDCP::TagValue,_std::less<ASDCP::UL>,_std::allocator<std::pair<const_ASDCP::UL,_ASDCP::TagValue>_>_>
    )._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    this_00 = *(_Rb_tree<ASDCP::UL,_std::pair<const_ASDCP::UL,_ASDCP::TagValue>,_std::_Select1st<std::pair<const_ASDCP::UL,_ASDCP::TagValue>_>,_std::less<ASDCP::UL>,_std::allocator<std::pair<const_ASDCP::UL,_ASDCP::TagValue>_>_>
                **)(p + 0x78);
    if (this_00 !=
        (_Rb_tree<ASDCP::UL,_std::pair<const_ASDCP::UL,_ASDCP::TagValue>,_std::_Select1st<std::pair<const_ASDCP::UL,_ASDCP::TagValue>_>,_std::less<ASDCP::UL>,_std::allocator<std::pair<const_ASDCP::UL,_ASDCP::TagValue>_>_>
         *)0x0) {
      std::
      _Rb_tree<ASDCP::UL,_std::pair<const_ASDCP::UL,_ASDCP::TagValue>,_std::_Select1st<std::pair<const_ASDCP::UL,_ASDCP::TagValue>_>,_std::less<ASDCP::UL>,_std::allocator<std::pair<const_ASDCP::UL,_ASDCP::TagValue>_>_>
      ::~_Rb_tree(this_00);
    }
    operator_delete(this_00,0x30);
    *(h__PrimerLookup **)(p + 0x78) = this_01;
    h__PrimerLookup::InitWithBatch(this_01,(Batch<ASDCP::MXF::Primer::LocalTagEntry> *)(p + 0x88));
    if ((int)local_a8._vptr_KLVPacket < 0) goto LAB_001a4cbc;
  }
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)&local_a8);
LAB_001a4cdf:
  Kumu::Result_t::~Result_t((Result_t *)&local_a8);
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::MXF::Primer::InitFromBuffer(const byte_t* p, ui32_t l)
{
  assert(m_Dict);
  Result_t result = KLVPacket::InitFromBuffer(p, l, m_Dict->ul(MDD_Primer));

  if ( ASDCP_SUCCESS(result) )
    {
      if (m_ValueStart + m_ValueLength > p + l)
      {
        DefaultLogSink().Error("Primer entry too long.\n");
        return RESULT_KLV_CODING(__LINE__, __FILE__);
      }
      Kumu::MemIOReader MemRDR(m_ValueStart, m_ValueLength);
      result = LocalTagEntryBatch.Unarchive(&MemRDR) ? RESULT_OK : RESULT_KLV_CODING(__LINE__, __FILE__);
    }

  if ( ASDCP_SUCCESS(result) )
    {
      m_Lookup = new h__PrimerLookup;
      m_Lookup->InitWithBatch(LocalTagEntryBatch);
    }

  if ( ASDCP_FAILURE(result) )
    DefaultLogSink().Error("Failed to initialize Primer.\n");

  return result;
}